

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.cpp
# Opt level: O3

void __thiscall Environment::define(Environment *this,Function *function)

{
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Function>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Function>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_00;
  ExternalFunction *pEVar1;
  size_t sVar2;
  const_iterator cVar3;
  iterator iVar4;
  __hashtable *__h;
  _Hash_node_base *p_Var5;
  string funcName;
  string local_110;
  string local_f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Function>
  local_d0;
  
  Function::name_abi_cxx11_(&local_110,function);
  sVar2 = Function::numParameters(function);
  anon_unknown.dwarf_51a6a::getFuncName(&local_f0,&local_110,(long)(int)sVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  p_Var5 = (this->mScopes)._M_h._M_before_begin._M_nxt;
  if (p_Var5 != (_Hash_node_base *)0x0) {
    do {
      this_00 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Function>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Function>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(p_Var5 + 9);
      cVar3 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Function>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Function>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(this_00,&local_f0);
      if (cVar3.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Function>,_true>
          ._M_cur == (__node_type *)0x0) {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Function>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_Function_&,_true>
                  (&local_d0,&local_f0,function);
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Function>,std::allocator<std::pair<std::__cxx11::string_const,Function>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<std::pair<std::__cxx11::string_const,Function>>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Function>,std::allocator<std::pair<std::__cxx11::string_const,Function>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)this_00,&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0.second.mInfoText._M_dataplus._M_p != &local_d0.second.mInfoText.field_2) {
          operator_delete(local_d0.second.mInfoText._M_dataplus._M_p,
                          local_d0.second.mInfoText.field_2._M_allocated_capacity + 1);
        }
        if (local_d0.second.mUserFunction.
            super___shared_ptr<UserFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_d0.second.mUserFunction.
                     super___shared_ptr<UserFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
          ;
        }
        if (local_d0.second.mExternalFunction.super__Function_base._M_manager != (_Manager_type)0x0)
        {
          pEVar1 = &local_d0.second.mExternalFunction;
          (*local_d0.second.mExternalFunction.super__Function_base._M_manager)
                    ((_Any_data *)pEVar1,(_Any_data *)pEVar1,__destroy_functor);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0.second.mName._M_dataplus._M_p != &local_d0.second.mName.field_2) {
          operator_delete(local_d0.second.mName._M_dataplus._M_p,
                          local_d0.second.mName.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0.first._M_dataplus._M_p != &local_d0.first.field_2) {
          operator_delete(local_d0.first._M_dataplus._M_p,
                          local_d0.first.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        iVar4 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Function>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Function>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(this_00,&local_f0);
        if (iVar4.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Function>,_true>
            ._M_cur == (__node_type *)0x0) {
          std::__throw_out_of_range("_Map_base::at");
        }
        std::__cxx11::string::_M_assign
                  ((string *)
                   ((long)iVar4.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Function>,_true>
                          ._M_cur + 0x28));
        *(bool *)((long)iVar4.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Function>,_true>
                        ._M_cur + 0x50) = function->mIsUserDefined;
        *(size_t *)
         ((long)iVar4.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Function>,_true>
                ._M_cur + 0x48) = function->mNumArgs;
        std::function<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>)>::
        operator=((function<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>)> *)
                  ((long)iVar4.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Function>,_true>
                         ._M_cur + 0x58),&function->mExternalFunction);
        *(element_type **)
         ((long)iVar4.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Function>,_true>
                ._M_cur + 0x78) =
             (function->mUserFunction).super___shared_ptr<UserFunction,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)iVar4.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Function>,_true>
                          ._M_cur + 0x80),
                   &(function->mUserFunction).
                    super___shared_ptr<UserFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__cxx11::string::_M_assign
                  ((string *)
                   ((long)iVar4.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Function>,_true>
                          ._M_cur + 0x88));
      }
      p_Var5 = p_Var5->_M_nxt;
    } while (p_Var5 != (_Hash_node_base *)0x0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Environment::define(Function function) {
	auto funcName = getFuncName(function.name(), (int) function.numParameters());

	for (auto& current : mScopes) {
		auto& scope = current.second;
		if (scope.functions().count(funcName) == 0) {
			scope.functions().insert({ funcName, function });
		} else {
			scope.functions().at(funcName) = function;
		}
	}
}